

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time-test.cc
# Opt level: O2

void __thiscall TimeTest_Format_Test::TestBody(TimeTest_Format_Test *this)

{
  tm *in_RCX;
  char *message;
  AssertHelper local_80;
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  tm tm;
  
  tm.tm_wday = 0;
  tm.tm_yday = 0;
  tm.tm_sec = 0;
  tm.tm_min = 0;
  tm.tm_zone = (char *)0x0;
  tm.tm_isdst = 0;
  tm._36_4_ = 0;
  tm.tm_gmtoff = 0;
  tm.tm_mon = 3;
  tm.tm_year = 0x74;
  tm.tm_hour = 0;
  tm.tm_mday = 0x19;
  fmt::v5::format<char[25],tm>(&local_68,(v5 *)"The date is {:%Y-%m-%d}.",(char (*) [25])&tm,in_RCX)
  ;
  testing::internal::CmpHelperEQ<char[24],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"The date is 2016-04-25.\"",
             "fmt::format(\"The date is {:%Y-%m-%d}.\", tm)",
             (char (*) [24])"The date is 2016-04-25.",&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_68);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/time-test.cc"
               ,0x16,message);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_68);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(TimeTest, Format) {
  std::tm tm = std::tm();
  tm.tm_year = 116;
  tm.tm_mon  = 3;
  tm.tm_mday = 25;
  EXPECT_EQ("The date is 2016-04-25.",
            fmt::format("The date is {:%Y-%m-%d}.", tm));
}